

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

bool __thiscall EdgeData::operator<(EdgeData *this,EdgeData *other)

{
  Edge EVar1;
  Edge EVar2;
  bool bVar3;
  
  bVar3 = true;
  if (other->width <= this->width) {
    if (this->width <= other->width) {
      if ((int)this->edgeClass < (int)other->edgeClass) {
        return true;
      }
      if ((int)this->edgeClass <= (int)other->edgeClass) {
        EVar1 = this->edge;
        EVar2 = other->edge;
        if (EVar2 == BottomEdge && EVar1 == TopEdge) {
          return true;
        }
        if (EVar1 != BottomEdge || EVar2 != TopEdge) {
          return EVar2 == RightEdge && EVar1 == LeftEdge;
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator< (const EdgeData &other) const {
        if (width < other.width) return true;
        if (width > other.width) return false;
        if (edgeClass < other.edgeClass) return true;
        if (edgeClass > other.edgeClass) return false;
        if (edge == QCss::TopEdge && other.edge == QCss::BottomEdge) return true;
        if (edge == QCss::BottomEdge && other.edge == QCss::TopEdge) return false;
        if (edge == QCss::LeftEdge && other.edge == QCss::RightEdge) return true;
        return false;
    }